

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<henson::NameMap>
          (reference_wrapper<henson::NameMap> obj,bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  NameMap *p;
  reference_wrapper<henson::NameMap> *t_value;
  bool *in_stack_ffffffffffffffa8;
  NameMap **in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  __uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  in_stack_ffffffffffffffc0;
  reference_wrapper<henson::NameMap> in_stack_ffffffffffffffc8;
  reference_wrapper<henson::NameMap> local_10 [2];
  
  std::reference_wrapper<henson::NameMap>::get(local_10);
  t_value = (reference_wrapper<henson::NameMap> *)&stack0xffffffffffffffc8;
  chaiscript::detail::Get_Type_Info<henson::NameMap>::get();
  chaiscript::detail::Any::Any<std::reference_wrapper<henson::NameMap>,void>
            ((Any *)&stack0xffffffffffffffc0,t_value);
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,henson::NameMap*&,bool&>
            ((Type_Info *)in_stack_ffffffffffffffc8._M_data,
             (Any *)in_stack_ffffffffffffffc0._M_t.
                    super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
                    .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl,
             (bool *)CONCAT17(1,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  chaiscript::detail::Any::~Any((Any *)0x302b44);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Data> get(std::reference_wrapper<T> obj, bool t_return_value)
          {
            auto p = &obj.get();
            return std::make_shared<Data>(
                  detail::Get_Type_Info<T>::get(),
                  chaiscript::detail::Any(std::move(obj)),
                  true,
                  p,
                  t_return_value
                );
          }